

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O2

Image * rw::xbox::rasterToImage(Raster *raster)

{
  uint8 uVar1;
  uint8 *puVar2;
  uint uVar3;
  uint uVar4;
  int32 y;
  int iVar5;
  Image *this;
  ulong uVar6;
  ulong uVar7;
  int32 x;
  uint depth;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int32 iVar11;
  uint uVar12;
  uint8 *imgrow;
  uint8 *puVar13;
  uint uVar14;
  uint8 *puVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  uint8 *__dest;
  uint8 *puVar19;
  uint uVar20;
  uint uVar21;
  size_t __n;
  bool bVar22;
  
  puVar2 = raster->pixels;
  if (puVar2 == (uint8 *)0x0) {
    Raster::lock(raster,0,2);
  }
  lVar18 = (long)nativeRasterOffset;
  if (*(char *)((long)&raster->height + lVar18 + 1) != '\x01') {
    uVar14 = raster->format;
    iVar5 = 0;
    if ((uVar14 >> 0xe & 1) == 0) {
      depth = 0x18;
      if ((uVar14 & 0xf00) != 0x600) {
        depth = (uint)((uVar14 & 0xf00) == 0x500) * 0x10 + 0x10;
      }
      bVar22 = true;
      if ((uVar14 >> 0xd & 1) != 0) {
        depth = 8;
        iVar5 = 0x100;
        goto LAB_001141c0;
      }
    }
    else {
      depth = 4;
      iVar5 = 0x10;
LAB_001141c0:
      bVar22 = false;
    }
    this = Image::create(raster->width,raster->height,depth);
    Image::allocate(this);
    if (!bVar22) {
      puVar15 = this->palette;
      puVar13 = *(uint8 **)((long)&raster->flags + lVar18);
      while (bVar22 = iVar5 != 0, iVar5 = iVar5 + -1, bVar22) {
        conv_BGRA8888_from_RGBA8888(puVar15,puVar13);
        puVar13 = puVar13 + 4;
        puVar15 = puVar15 + 4;
      }
    }
    puVar15 = this->pixels;
    puVar13 = raster->pixels;
    uVar14 = this->width;
    uVar9 = this->height;
    iVar5 = this->bpp;
    __n = (size_t)iVar5;
    iVar8 = 1;
    uVar20 = 0;
    uVar17 = 0;
    uVar21 = 1;
    do {
      uVar12 = uVar21 * 2;
      uVar3 = uVar21;
      uVar4 = uVar12;
      if ((int)uVar14 <= iVar8) {
        uVar12 = 0;
        uVar3 = 0;
        uVar4 = uVar21;
      }
      uVar20 = uVar20 | uVar3;
      uVar3 = 0;
      uVar21 = uVar4;
      if (iVar8 < (int)uVar9) {
        uVar3 = uVar4;
        uVar21 = uVar4 * 2;
        uVar12 = uVar4 * 2;
      }
      uVar17 = uVar17 | uVar3;
      iVar8 = iVar8 * 2;
    } while (uVar12 != 0);
    uVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar14) {
      uVar7 = (ulong)uVar14;
    }
    uVar16 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar16 = uVar6;
    }
    uVar9 = 0;
    puVar19 = puVar15;
    for (; uVar6 != uVar16; uVar6 = uVar6 + 1) {
      uVar21 = 0;
      uVar10 = uVar7;
      __dest = puVar19;
      while (bVar22 = uVar10 != 0, uVar10 = uVar10 - 1, bVar22) {
        memcpy(__dest,puVar13 + (int)((uVar21 | uVar9) * iVar5),__n);
        uVar21 = uVar21 - uVar20 & uVar20;
        __dest = __dest + __n;
      }
      uVar9 = uVar9 - uVar17 & uVar17;
      puVar19 = puVar19 + (long)(int)uVar14 * __n;
    }
    if (8 < depth) {
      for (iVar5 = 0; iVar5 < this->height; iVar5 = iVar5 + 1) {
        puVar13 = puVar15;
        for (iVar8 = 0; iVar8 < this->width; iVar8 = iVar8 + 1) {
          uVar14 = raster->format & 0xf00;
          if ((uVar14 == 0x600) || (uVar14 == 0x500)) {
            uVar1 = *puVar13;
            *puVar13 = puVar13[2];
            puVar13[2] = uVar1;
            puVar13 = puVar13 + this->bpp;
          }
        }
        puVar15 = puVar15 + this->stride;
      }
    }
    Image::compressPalette(this);
    goto LAB_001143b1;
  }
  iVar5 = raster->width;
  if (raster->width < 5) {
    iVar5 = 4;
  }
  iVar11 = 4;
  if (4 < raster->height) {
    iVar11 = raster->height;
  }
  this = Image::create(iVar5,iVar11,0x20);
  Image::allocate(this);
  iVar5 = *(int *)((long)&raster->format + lVar18);
  if (iVar5 == 0xf) {
    iVar11 = 5;
LAB_00114393:
    Image::setPixelsDXT(this,iVar11,raster->pixels);
  }
  else {
    if (iVar5 == 0xe) {
      iVar11 = 3;
      goto LAB_00114393;
    }
    if (iVar5 != 0xc) {
      Image::destroy(this);
      this = (Image *)0x0;
      goto LAB_001143b1;
    }
    Image::setPixelsDXT(this,1,raster->pixels);
    if (*(char *)((long)&raster->height + lVar18) == '\0') {
      Image::removeMask(this);
    }
  }
  iVar11 = raster->height;
  this->width = raster->width;
  this->height = iVar11;
LAB_001143b1:
  if (puVar2 == (uint8 *)0x0) {
    Raster::unlock(raster,0);
  }
  return this;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	int32 depth;
	Image *image;

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKREAD);
		unlock = true;
	}

	XboxRaster *natras = GETXBOXRASTEREXT(raster);
	if(natras->customFormat){
		int w = raster->width;
		int h = raster->height;
		// pixels are in the upper right corner
		if(w < 4) w = 4;
		if(h < 4) h = 4;
		image = Image::create(w, h, 32);
		image->allocate();
		uint8 *pix = raster->pixels;
		switch(natras->format){
		case D3DFMT_DXT1:
			image->setPixelsDXT(1, pix);
			// TODO: is this correct?
			if(!natras->hasAlpha)
				image->removeMask();
			break;
		case D3DFMT_DXT3:
			image->setPixelsDXT(3, pix);
			break;
		case D3DFMT_DXT5:
			image->setPixelsDXT(5, pix);
			break;
		default:
			assert(0 && "unknown format");
			image->destroy();
			if(unlock)
				raster->unlock(0);
			return nil;
		}
		// fix it up again
		image->width = raster->width;
		image->height = raster->height;

		if(unlock)
			raster->unlock(0);
		return image;
	}

	switch(raster->format & 0xF00){
	case Raster::C1555:
		depth = 16;
		break;
	case Raster::C8888:
		depth = 32;
		break;
	case Raster::C888:
		depth = 24;
		break;
	case Raster::C555:
		depth = 16;
		break;

	default:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		assert(0 && "unsupported raster format");
	}
	int32 pallength = 0;
	if((raster->format & Raster::PAL4) == Raster::PAL4){
		depth = 4;
		pallength = 16;
	}else if((raster->format & Raster::PAL8) == Raster::PAL8){
		depth = 8;
		pallength = 256;
	}

	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	if(pallength){
		uint8 *out = image->palette;
		uint8 *in = (uint8*)natras->palette;
		// bytes are BGRA unlike regular d3d!
		for(int32 i = 0; i < pallength; i++){
			conv_BGRA8888_from_RGBA8888(out, in);
			in += 4;
			out += 4;
		}
	}

	uint8 *imgpixels = image->pixels;
	uint8 *pixels = raster->pixels;

	// NB:
	assert(image->bpp == (int)natras->bpp);
	assert(image->stride == raster->stride);
	unswizzle(imgpixels, pixels, image->width, image->height, image->bpp);
	// Fix RGB order
	uint8 tmp;
	if(depth > 8)
		for(int32 y = 0; y < image->height; y++){
			uint8 *imgrow = imgpixels;
		//	uint8 *rasrow = pixels;
			for(int32 x = 0; x < image->width; x++){
				switch(raster->format & 0xF00){
				case Raster::C8888:
				case Raster::C888:
					tmp = imgrow[0];
					imgrow[0] = imgrow[2];
					imgrow[2] = tmp;
					imgrow += image->bpp;
					break;
				}
			}
			imgpixels += image->stride;
		//	pixels += raster->stride;
		}
	image->compressPalette();

	if(unlock)
		raster->unlock(0);

	return image;
}